

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UBool icu_63::RegexPattern::matches
                (UnicodeString *regex,UnicodeString *input,UParseError *pe,UErrorCode *status)

{
  UBool UVar1;
  RegexPattern *this;
  RegexMatcher *this_00;
  
  if (U_ZERO_ERROR < *status) {
    return '\0';
  }
  this = compile(regex,0,pe,status);
  this_00 = matcher(this,input,status);
  UVar1 = RegexMatcher::matches(this_00,status);
  RegexMatcher::~RegexMatcher(this_00);
  UMemory::operator_delete((UMemory *)this_00,status);
  ~RegexPattern(this);
  UMemory::operator_delete((UMemory *)this,status);
  return UVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }